

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offBasePtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  ulong uVar1;
  BYTE *pBVar2;
  U32 UVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  int iVar8;
  byte bVar9;
  uint *puVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint *puVar16;
  ulong uVar17;
  BYTE *pBVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  U32 UVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  byte *pbVar35;
  byte *pInLimit;
  BYTE *pBVar36;
  uint uVar37;
  uint *local_108;
  uint *local_100;
  uint local_f8;
  ulong local_b0;
  U32 dummy32;
  uint local_54;
  ulong local_50;
  uint *local_48;
  BYTE *local_40;
  byte *local_38;
  
  uVar19 = (ms->cParams).hashLog;
  if (0x20 < uVar19) {
LAB_0019f63c:
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  pUVar4 = ms->hashTable;
  local_50 = (ulong)(mls - 5);
  switch(local_50) {
  case 0:
    uVar30 = *(long *)ip * -0x30e4432345000000;
    goto LAB_0019ec42;
  case 1:
    uVar30 = ZSTD_hash6Ptr(ip,uVar19);
    break;
  case 2:
    uVar30 = *(long *)ip * -0x30e44323405a9d00;
LAB_0019ec42:
    uVar30 = uVar30 >> (-(char)uVar19 & 0x3fU);
    break;
  case 3:
    uVar30 = ZSTD_hash8Ptr(ip,uVar19);
    break;
  default:
    uVar30 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar19 & 0x1fU));
  }
  pBVar5 = (ms->window).base;
  uVar28 = (int)ip - (int)pBVar5;
  uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar3 = (ms->window).lowLimit;
  UVar31 = uVar28 - uVar19;
  if (uVar28 - UVar3 <= uVar19) {
    UVar31 = UVar3;
  }
  if (ms->loadedDictEnd != 0) {
    UVar31 = UVar3;
  }
  uVar19 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar24 = uVar28 - uVar19;
  if (uVar28 < uVar19) {
    uVar24 = 0;
  }
  uVar32 = UVar31;
  if (UVar31 < uVar24) {
    uVar32 = uVar24;
  }
  local_f8 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x747b,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (dictMode == ZSTD_dedicatedDictSearch) {
    __assert_fail("dictMode != ZSTD_dedicatedDictSearch",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x747c,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_48 = pUVar4 + uVar30;
  pUVar4 = ms->chainTable;
  puVar10 = local_48;
  uVar25 = local_f8;
  uVar26 = 0;
  while (uVar34 = *puVar10, uVar32 < uVar34) {
    puVar10 = pUVar4 + (uVar34 & uVar19) * 2;
    if ((puVar10[1] != 1) || (uVar25 < 2)) {
      if (puVar10[1] == 1) {
        puVar10[0] = 0;
        puVar10[1] = 0;
      }
      break;
    }
    puVar10[1] = uVar26;
    uVar25 = uVar25 - 1;
    uVar26 = uVar34;
  }
  do {
    if (uVar26 == 0) break;
    pBVar6 = (ms->window).dictBase;
    uVar34 = (ms->window).dictLimit;
    uVar30 = (ulong)uVar34;
    local_38 = pBVar6 + uVar30;
    pInLimit = iend;
    pBVar36 = pBVar5;
    if (uVar26 < uVar34) {
      pInLimit = local_38;
      pBVar36 = pBVar6;
    }
    uVar37 = (ms->window).lowLimit;
    bVar9 = (byte)(ms->cParams).windowLog & 0x1f;
    uVar20 = 1 << bVar9;
    uVar23 = uVar26 - uVar20;
    if (uVar26 - uVar37 <= uVar20) {
      uVar23 = uVar37;
    }
    if (uVar26 < uVar32) {
      __assert_fail("curr >= btLow",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x73d4,
                    "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                   );
    }
    pbVar35 = pBVar36 + uVar26;
    if (pInLimit <= pbVar35) {
      __assert_fail("ip < iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x73d5,
                    "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                   );
    }
    uVar37 = pUVar4[(ulong)((uVar26 & uVar19) * 2) + 1];
    uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    local_40 = pBVar5 + uVar30;
    local_100 = pUVar4 + (uVar26 & uVar33) * 2;
    uVar20 = *local_100;
    uVar21 = 0 << bVar9;
    uVar14 = 0;
    puVar10 = local_100 + 1;
    uVar13 = 0;
LAB_0019ee61:
    uVar17 = (ulong)uVar20;
    if ((uVar25 == uVar21) || (uVar20 <= uVar23)) goto LAB_0019f00e;
    uVar12 = uVar13;
    if (uVar14 < uVar13) {
      uVar12 = uVar14;
    }
    if (uVar26 <= uVar20) {
      __assert_fail("matchIndex < curr",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x73da,
                    "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                   );
    }
    uVar1 = uVar12 + uVar17;
    pBVar36 = pBVar5;
    if (dictMode == ZSTD_extDict) {
      if ((uVar26 < uVar34) || (uVar30 <= uVar1)) {
        if (uVar1 < uVar30) {
          pBVar36 = pBVar6;
        }
        goto LAB_0019ef1f;
      }
      sVar11 = ZSTD_count_2segments
                         (pbVar35 + uVar12,pBVar6 + uVar17 + uVar12,pInLimit,local_38,local_40);
      uVar12 = sVar11 + uVar12;
      pBVar36 = pBVar5 + uVar17;
      if (uVar12 + uVar17 < uVar30) {
        pBVar36 = pBVar6 + uVar17;
      }
    }
    else {
LAB_0019ef1f:
      if ((uVar34 <= uVar26) && (uVar1 < uVar30)) {
        __assert_fail("(matchIndex+matchLength >= dictLimit) || (curr < dictLimit)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x73e6,
                      "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      sVar11 = ZSTD_count(pbVar35 + uVar12,pBVar36 + uVar17 + uVar12,pInLimit);
      uVar12 = sVar11 + uVar12;
      pBVar36 = pBVar36 + uVar17;
    }
    if (pbVar35 + uVar12 == pInLimit) goto LAB_0019f00e;
    puVar16 = pUVar4 + (uVar20 & uVar33) * 2;
    if (pbVar35[uVar12] <= pBVar36[uVar12]) {
      *puVar10 = uVar20;
      puVar10 = puVar16;
      if (uVar20 <= uVar32) {
        puVar10 = &local_54;
        goto LAB_0019f00e;
      }
LAB_0019efd6:
      uVar20 = *puVar10;
      uVar21 = uVar21 + 1;
      puVar10 = puVar16;
      uVar13 = uVar12;
      goto LAB_0019ee61;
    }
    *local_100 = uVar20;
    if (uVar32 < uVar20) {
      local_100 = puVar16 + 1;
      puVar16 = puVar10;
      puVar10 = local_100;
      uVar14 = uVar12;
      uVar12 = uVar13;
      goto LAB_0019efd6;
    }
    local_100 = &local_54;
LAB_0019f00e:
    *puVar10 = 0;
    *local_100 = 0;
    uVar25 = uVar25 + 1;
    uVar26 = uVar37;
  } while( true );
  pBVar6 = (ms->window).dictBase;
  uVar17 = (ulong)(ms->window).dictLimit;
  uVar13 = (ulong)((uVar19 & uVar28) * 2);
  local_108 = pUVar4 + uVar13;
  uVar25 = uVar28 + 9;
  uVar32 = *local_48;
  *local_48 = uVar28;
  uVar14 = 0;
  uVar30 = 0;
  local_b0 = 0;
  puVar10 = pUVar4 + uVar13 + 1;
LAB_0019f09b:
  uVar13 = (ulong)uVar32;
  if ((local_f8 == 0) || (uVar32 <= UVar31)) goto LAB_0019f27e;
  uVar12 = uVar30;
  if (uVar14 < uVar30) {
    uVar12 = uVar14;
  }
  if ((dictMode == ZSTD_extDict) && (uVar12 + uVar13 < uVar17)) {
    pBVar2 = pBVar6 + uVar13;
    sVar11 = ZSTD_count_2segments(ip + uVar12,pBVar2 + uVar12,iend,pBVar6 + uVar17,pBVar5 + uVar17);
    uVar12 = sVar11 + uVar12;
    pBVar36 = pBVar5 + uVar13;
    if (uVar12 + uVar13 < uVar17) {
      pBVar36 = pBVar2;
    }
  }
  else {
    sVar11 = ZSTD_count(ip + uVar12,pBVar5 + uVar13 + uVar12,iend);
    uVar12 = sVar11 + uVar12;
    pBVar36 = pBVar5 + uVar13;
  }
  if (local_b0 < uVar12) {
    if (uVar25 - uVar32 < uVar12) {
      uVar25 = (int)uVar12 + uVar32;
    }
    uVar26 = (uVar28 - uVar32) + 1;
    iVar15 = 0x1f;
    if (uVar26 != 0) {
      for (; uVar26 >> iVar15 == 0; iVar15 = iVar15 + -1) {
      }
    }
    iVar29 = 0x1f;
    if ((int)*offBasePtr != 0) {
      for (; (uint)*offBasePtr >> iVar29 == 0; iVar29 = iVar29 + -1) {
      }
    }
    if (iVar15 - iVar29 < ((int)uVar12 - (int)local_b0) * 4) {
      if (uVar28 == uVar32) {
        __assert_fail("(curr - matchIndex)>0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x74c2,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      *offBasePtr = (ulong)((uVar28 - uVar32) + 3);
      local_b0 = uVar12;
    }
    if (ip + uVar12 == iend) {
      if (dictMode == ZSTD_dictMatchState) {
        *puVar10 = 0;
        *local_108 = 0;
        goto LAB_0019f563;
      }
LAB_0019f27e:
      *puVar10 = 0;
      *local_108 = 0;
      if (0x40000000 < local_f8) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x74df,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      if (dictMode == ZSTD_dictMatchState && local_f8 != 0) {
        pZVar7 = ms->dictMatchState;
        uVar19 = (pZVar7->cParams).hashLog;
        if (0x20 < uVar19) goto LAB_0019f63c;
        if ((uint)local_50 < 4) {
          sVar11 = (*(code *)(&DAT_0024f43c + *(int *)(&DAT_0024f43c + local_50 * 4)))();
          return sVar11;
        }
        puVar10 = pZVar7->hashTable + ((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar19 & 0x1fU));
        pBVar5 = (ms->window).base;
        uVar19 = (ms->window).dictLimit;
        iVar15 = (int)ip - (int)pBVar5;
        pBVar6 = (pZVar7->window).nextSrc;
        pBVar36 = (pZVar7->window).base;
        uVar30 = (long)pBVar6 - (long)pBVar36;
        uVar24 = (pZVar7->window).lowLimit;
        iVar29 = (int)uVar30;
        uVar34 = (ms->window).lowLimit - iVar29;
        pUVar4 = pZVar7->chainTable;
        uVar26 = ~(-1 << ((char)(pZVar7->cParams).chainLog - 1U & 0x1f));
        uVar32 = iVar29 - uVar26;
        if (iVar29 - uVar24 <= uVar26) {
          uVar32 = uVar24;
        }
        uVar13 = 0;
        uVar14 = 0;
        for (uVar37 = 0; local_f8 != uVar37; uVar37 = uVar37 + 1) {
          uVar23 = *puVar10;
          uVar17 = (ulong)uVar23;
          if (uVar23 <= uVar24) break;
          uVar12 = uVar14;
          if (uVar13 < uVar14) {
            uVar12 = uVar13;
          }
          pBVar2 = pBVar36 + uVar17;
          sVar11 = ZSTD_count_2segments(ip + uVar12,pBVar2 + uVar12,iend,pBVar6,pBVar5 + uVar19);
          uVar12 = sVar11 + uVar12;
          pBVar18 = pBVar5 + uVar17 + uVar34;
          if (uVar12 + uVar17 < (uVar30 & 0xffffffff)) {
            pBVar18 = pBVar2;
          }
          if (local_b0 < uVar12) {
            iVar22 = uVar34 + uVar23;
            iVar27 = iVar15 - iVar22;
            uVar20 = iVar27 + 1;
            iVar29 = 0x1f;
            if (uVar20 != 0) {
              for (; uVar20 >> iVar29 == 0; iVar29 = iVar29 + -1) {
              }
            }
            uVar20 = (int)*offBasePtr + 1;
            iVar8 = 0x1f;
            if (uVar20 != 0) {
              for (; uVar20 >> iVar8 == 0; iVar8 = iVar8 + -1) {
              }
            }
            if (iVar29 - iVar8 < ((int)uVar12 - (int)local_b0) * 4) {
              if (iVar15 == iVar22) {
                __assert_fail("(curr - matchIndex)>0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x7440,
                              "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                             );
              }
              *offBasePtr = (ulong)(iVar27 + 3);
              local_b0 = uVar12;
            }
            if (ip + uVar12 == iend) break;
          }
          puVar10 = pUVar4 + (uVar23 & uVar26) * 2;
          if (pBVar18[uVar12] < ip[uVar12]) {
            if (uVar23 <= uVar32) break;
            puVar10 = puVar10 + 1;
            uVar13 = uVar12;
          }
          else {
            uVar14 = uVar12;
            if (uVar23 <= uVar32) break;
          }
        }
        if ((2 < local_b0) && (*offBasePtr < 4)) {
          __assert_fail("OFFBASE_IS_OFFSET(*offsetPtr)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7454,
                        "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                       );
        }
      }
LAB_0019f563:
      if (uVar25 <= uVar28 + 8) {
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x74e7,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      ms->nextToUpdate = uVar25 - 8;
      if ((2 < local_b0) && (*offBasePtr < 4)) {
        __assert_fail("OFFBASE_IS_OFFSET(*offBasePtr)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x74ea,
                      "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                     );
      }
      return local_b0;
    }
  }
  puVar16 = pUVar4 + (uVar32 & uVar19) * 2;
  if (pBVar36[uVar12] < ip[uVar12]) {
    *local_108 = uVar32;
    if (uVar32 <= uVar24) {
      local_108 = &dummy32;
      goto LAB_0019f27e;
    }
    local_108 = puVar16 + 1;
    puVar16 = puVar10;
    puVar10 = local_108;
    uVar14 = uVar12;
  }
  else {
    *puVar10 = uVar32;
    uVar30 = uVar12;
    puVar10 = puVar16;
    if (uVar32 <= uVar24) {
      puVar10 = &dummy32;
      goto LAB_0019f27e;
    }
  }
  uVar32 = *puVar10;
  puVar10 = puVar16;
  local_f8 = local_f8 - 1;
  goto LAB_0019f09b;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offBasePtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        for (; nbCompares && (matchIndex > windowLow); --nbCompares) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr - matchIndex + 1) - ZSTD_highbit32((U32)*offBasePtr)) )
                    bestLength = matchLength, *offBasePtr = OFFSET_TO_OFFBASE(curr - matchIndex);
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)); /* Check we haven't underflowed. */
        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offBasePtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - (U32)OFFBASE_TO_OFFSET(*offBasePtr); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offBasePtr, mIndex);
        }
        return bestLength;
    }
}